

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_planesurface.cpp
# Opt level: O0

void __thiscall ON_ClippingPlaneDataList::~ON_ClippingPlaneDataList(ON_ClippingPlaneDataList *this)

{
  ON_ClippingPlaneData *this_00;
  int iVar1;
  ON_ClippingPlaneData **ppOVar2;
  ON_ClippingPlaneData *data;
  int i;
  ON_ClippingPlaneDataList *this_local;
  
  for (data._4_4_ = 0; iVar1 = ON_SimpleArray<ON_ClippingPlaneData_*>::Count(&this->m_list),
      data._4_4_ < iVar1; data._4_4_ = data._4_4_ + 1) {
    ppOVar2 = ON_SimpleArray<ON_ClippingPlaneData_*>::operator[](&this->m_list,data._4_4_);
    this_00 = *ppOVar2;
    if ((this_00 != (ON_ClippingPlaneData *)0x0) && (this_00 != (ON_ClippingPlaneData *)0x0)) {
      ON_ClippingPlaneData::~ON_ClippingPlaneData(this_00);
      operator_delete(this_00,0x50);
    }
    ppOVar2 = ON_SimpleArray<ON_ClippingPlaneData_*>::operator[](&this->m_list,data._4_4_);
    *ppOVar2 = (ON_ClippingPlaneData *)0x0;
  }
  ON_SimpleArray<ON_ClippingPlaneData_*>::~ON_SimpleArray(&this->m_list);
  return;
}

Assistant:

ON_ClippingPlaneDataList::~ON_ClippingPlaneDataList()
{
  for(int i=0; i<m_list.Count(); i++)
  {
    ON_ClippingPlaneData* data = m_list[i];
    if (data)
      delete data;
    m_list[i] = nullptr;
  }
}